

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESOINN.cpp
# Opt level: O0

void __thiscall soinn::ESOINN::load(ESOINN *this,string *filename)

{
  undefined8 uVar1;
  nvp<soinn::ESOINN> local_2d0 [2];
  undefined1 local_2b0 [8];
  xml_iarchive ia;
  ifstream ifs;
  string *filename_local;
  ESOINN *this_local;
  
  clear(this);
  uVar1 = std::__cxx11::string::c_str();
  std::ifstream::ifstream(&ia.field_0x88,uVar1,8);
  boost::archive::xml_iarchive::xml_iarchive((xml_iarchive *)local_2b0,(istream *)&ia.field_0x88,0);
  local_2d0[0] = boost::serialization::make_nvp<soinn::ESOINN>("*const_cast<ESOINN*>(this)",this);
  boost::archive::detail::interface_iarchive<boost::archive::xml_iarchive>::operator>>
            ((interface_iarchive<boost::archive::xml_iarchive> *)local_2b0,local_2d0);
  boost::archive::xml_iarchive::~xml_iarchive((xml_iarchive *)local_2b0);
  std::ifstream::~ifstream(&ia.field_0x88);
  return;
}

Assistant:

void ESOINN::load(std::string filename)
{
    clear();
    std::ifstream ifs(filename.c_str());
    boost::archive::xml_iarchive ia(ifs);
    ia >> BOOST_SERIALIZATION_NVP(*const_cast<ESOINN*>(this));
}